

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void cf_aes_decrypt(cf_aes_context *ctx,uint8_t *in,uint8_t *out)

{
  uint32_t local_44;
  uint32_t *puStack_40;
  uint32_t round;
  uint32_t *round_keys;
  uint32_t state [4];
  uint8_t *out_local;
  uint8_t *in_local;
  cf_aes_context *ctx_local;
  
  if (((ctx->rounds != 10) && (ctx->rounds != 0xc)) && (ctx->rounds != 0xe)) {
    abort();
  }
  round_keys._0_4_ = read32_be(in);
  round_keys._4_4_ = read32_be(in + 4);
  state[0] = read32_be(in + 8);
  state[1] = read32_be(in + 0xc);
  puStack_40 = ctx->ks + (ctx->rounds << 2);
  add_round_key((uint32_t *)&round_keys,puStack_40);
  local_44 = ctx->rounds;
  while (puStack_40 = puStack_40 + -4, local_44 = local_44 - 1, local_44 != 0) {
    inv_shift_rows((uint32_t *)&round_keys);
    inv_sub_block((uint32_t *)&round_keys);
    add_round_key((uint32_t *)&round_keys,puStack_40);
    inv_mix_columns((uint32_t *)&round_keys);
  }
  inv_shift_rows((uint32_t *)&round_keys);
  inv_sub_block((uint32_t *)&round_keys);
  add_round_key((uint32_t *)&round_keys,puStack_40);
  write32_be((uint32_t)round_keys,out);
  write32_be(round_keys._4_4_,out + 4);
  write32_be(state[0],out + 8);
  write32_be(state[1],out + 0xc);
  return;
}

Assistant:

void cf_aes_decrypt(const cf_aes_context *ctx,
                    const uint8_t in[AES_BLOCKSZ],
                    uint8_t out[AES_BLOCKSZ])
{
  assert(ctx->rounds == AES128_ROUNDS ||
         ctx->rounds == AES192_ROUNDS ||
         ctx->rounds == AES256_ROUNDS);

  uint32_t state[4] = {
    read32_be(in + 0),
    read32_be(in + 4),
    read32_be(in + 8),
    read32_be(in + 12)
  };

  const uint32_t *round_keys = &ctx->ks[ctx->rounds << 2];
  add_round_key(state, round_keys);
  round_keys -= 4;

  uint32_t round;
  for (round = ctx->rounds - 1; round != 0; round--)
  {
    inv_shift_rows(state);
    inv_sub_block(state);
    add_round_key(state, round_keys);
    inv_mix_columns(state);
    round_keys -= 4;
  }

  inv_shift_rows(state);
  inv_sub_block(state);
  add_round_key(state, round_keys);
  
  write32_be(state[0], out + 0);
  write32_be(state[1], out + 4);
  write32_be(state[2], out + 8);
  write32_be(state[3], out + 12);
}